

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int dtype_isvalid(char *dtype)

{
  int iVar1;
  int width;
  char *dtype_local;
  
  if (dtype == (char *)0x0) {
    dtype_local._4_4_ = 0;
  }
  else if (((int)*dtype - 0x3cU < 3) || (*dtype == 0x7c)) {
    iVar1 = (int)dtype[1];
    if ((((iVar1 == 0x53) || (iVar1 - 0x62U < 2)) || (iVar1 == 0x66)) ||
       ((iVar1 == 0x69 || (iVar1 == 0x75)))) {
      iVar1 = atoi(dtype + 2);
      if ((iVar1 < 0x11) && (0 < iVar1)) {
        dtype_local._4_4_ = 1;
      }
      else {
        dtype_local._4_4_ = 0;
      }
    }
    else {
      dtype_local._4_4_ = 0;
    }
  }
  else {
    dtype_local._4_4_ = 0;
  }
  return dtype_local._4_4_;
}

Assistant:

static int
dtype_isvalid(const char * dtype)
{
    if(!dtype)
        return 0;
    switch(dtype[0]) {
        case '<':
        case '>':
        case '|':
        case '=':
            break;
        default:
            return 0;
    }
    switch(dtype[1]) {
        case 'S':
        case 'b':
        case 'i':
        case 'f':
        case 'u':
        case 'c':
            break;
        default:
            return 0;
    }
    int width = atoi(&dtype[2]);
    if(width > 16 || width <= 0)
        return 0;
    return 1;
}